

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardsurface.h
# Opt level: O1

void __thiscall rengine::StandardSurface::onEvent(StandardSurface *this,Event *e)

{
  undefined8 uVar1;
  Renderer *pRVar2;
  long *plVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  mat4 local_b4;
  undefined1 local_70 [8];
  mat4 invNodeMatrix;
  bool inv;
  
  if (2 < e->m_type - PointerDown) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"virtual void rengine::StandardSurface::onEvent(Event *)",0x37)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,": unknown event type=",0x15);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,e->m_type);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    return;
  }
  pRVar2 = (this->m_renderer)._M_t.
           super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>._M_t.
           super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>.
           super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl;
  if ((pRVar2 != (Renderer *)0x0) && (pRVar2->m_sceneRoot != (Node *)0x0)) {
    if (this->m_pointerEventReceiver == (Node *)0x0) {
      deliverPointerEventInScene(this,pRVar2->m_sceneRoot,(PointerEvent *)e);
      return;
    }
    invNodeMatrix.m[0xf]._3_1_ = '\0';
    TransformNode::matrixFor(&local_b4,this->m_pointerEventReceiver,pRVar2->m_sceneRoot);
    mat4::inverted((mat4 *)local_70,&local_b4,(bool *)((long)invNodeMatrix.m + 0x3f));
    fVar4 = 0.0;
    fVar5 = 0.0;
    if (invNodeMatrix.m[0xf]._3_1_ == '\x01') {
      uVar1 = *(undefined8 *)((long)&e[1]._vptr_Event + 4);
      fVar5 = (float)uVar1;
      fVar6 = (float)((ulong)uVar1 >> 0x20);
      fVar4 = (float)local_70._0_4_ * fVar5 + (float)local_70._4_4_ * fVar6 + invNodeMatrix.m[1];
      fVar5 = invNodeMatrix.m[2] * fVar5 + fVar6 * invNodeMatrix.m[3] + invNodeMatrix.m[5];
    }
    *(ulong *)&e->field_0xc = CONCAT44(fVar5,fVar4);
    (*(this->m_pointerEventReceiver->super_SignalEmitter)._vptr_SignalEmitter[3])
              (this->m_pointerEventReceiver,e);
  }
  return;
}

Assistant:

inline void StandardSurface::onEvent(Event *e)
{

    switch (e->type()) {
    case Event::PointerDown:
    case Event::PointerUp:
    case Event::PointerMove:
        if (m_renderer && m_renderer->sceneRoot()) {
            PointerEvent *pe = PointerEvent::from(e);
            if (m_pointerEventReceiver) {
                bool inv = false;
                mat4 invNodeMatrix = TransformNode::matrixFor(m_pointerEventReceiver, m_renderer->sceneRoot()).inverted(&inv);
                if (inv)
                    pe->setPosition(invNodeMatrix * pe->positionInSurface());
                else
                    pe->setPosition(vec2());
                m_pointerEventReceiver->onPointerEvent(pe);
            } else {
                deliverPointerEventInScene(m_renderer->sceneRoot(), pe);
            }
        }
        break;
    default:
        std::cerr << __PRETTY_FUNCTION__ << ": unknown event type=" << e->type() << std::endl;
        break;
    }
}